

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O3

adjusted_mantissa __thiscall
fast_float::negative_digit_comp<double>
          (fast_float *this,bigint *bigmant,adjusted_mantissa am,int32_t exponent)

{
  ushort uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  fast_float *this_00;
  int iVar9;
  uint uVar10;
  bool bVar11;
  adjusted_mantissa aVar12;
  bigint theor_digits;
  bigint local_228;
  
  iVar5 = am.power2;
  iVar8 = (int)am.mantissa;
  if (iVar8 < -10) {
    iVar7 = 1 - iVar8;
    iVar9 = 0;
    if (iVar7 < 0x40) {
      iVar9 = iVar7;
    }
    uVar4 = 0;
    if (iVar7 < 0x40) {
      uVar4 = (ulong)bigmant >> ((byte)iVar9 & 0x3f);
    }
    uVar6 = (ulong)(0xfffffffffffff < uVar4);
  }
  else {
    uVar6 = 0x7ff;
    uVar4 = 0;
    if (iVar8 < 0x7f4) {
      uVar6 = (ulong)(iVar8 + 0xb);
      uVar4 = (ulong)bigmant >> 0xb & 0xfffffffffffff;
    }
  }
  uVar6 = (uVar6 << 0x34 | uVar4) & 0x7ff0000000000000;
  if (uVar6 == 0) {
    uVar4 = uVar4 & 0xfffffffffffff;
    iVar9 = -0x433;
  }
  else {
    uVar4 = (uVar4 & 0xfffffffffffff) + 0x10000000000000;
    iVar9 = (uint)(uVar6 >> 0x34) - 0x434;
  }
  memset(local_228.vec.data + 1,0,0x1f0);
  local_228.vec.data[0] = uVar4 * 2 + 1;
  local_228.vec.length = 1;
  uVar10 = iVar9 - iVar5;
  if (iVar5 != 0) {
    bigint::pow5(&local_228,-iVar5);
  }
  if ((int)uVar10 < 1) {
    if (-1 < (int)uVar10) goto LAB_0012da5c;
    uVar10 = -uVar10;
    this_00 = this;
  }
  else {
    this_00 = (fast_float *)&local_228;
  }
  bigint::shl((bigint *)this_00,(ulong)uVar10);
LAB_0012da5c:
  uVar1 = *(ushort *)(this + 0x1f0);
  bVar3 = 1;
  if (local_228.vec.length < uVar1) {
    bVar11 = false;
  }
  else {
    uVar4 = (ulong)uVar1;
    if (uVar1 < local_228.vec.length) {
      bVar3 = 0;
      bVar11 = false;
    }
    else {
      do {
        bVar11 = uVar4 == 0;
        uVar6 = uVar4 - 1;
        if (bVar11) break;
        uVar2 = local_228.vec.data[uVar4 - 1];
        if (uVar2 < *(ulong *)(this + uVar6 * 8)) goto LAB_0012dab1;
        uVar4 = uVar6;
      } while (uVar2 <= *(ulong *)(this + uVar6 * 8));
      bVar3 = 0;
    }
  }
LAB_0012dab1:
  if (iVar8 < -10) {
    iVar8 = 1 - iVar8;
    iVar5 = 0;
    if (iVar8 < 0x40) {
      iVar5 = iVar8;
    }
    uVar4 = 0;
    if (iVar8 < 0x40) {
      uVar4 = (ulong)bigmant >> ((byte)iVar5 & 0x3f);
    }
    uVar4 = (byte)(bVar3 | bVar11 & (byte)uVar4) + uVar4;
    uVar10 = (uint)(0xfffffffffffff < uVar4);
  }
  else {
    uVar4 = (ulong)(byte)(bVar3 | (byte)((ulong)bigmant >> 0xb) & 1 & bVar11) +
            ((ulong)bigmant >> 0xb);
    bVar11 = uVar4 >> 0x35 == 0;
    uVar10 = (iVar8 - (uint)bVar11) + 0xc;
    uVar4 = uVar4 & 0x2fffffffffffff;
    if (!bVar11) {
      uVar4 = 0;
    }
    if (0x7fe < uVar10) {
      uVar4 = 0;
      uVar10 = 0x7ff;
    }
  }
  aVar12.power2 = uVar10;
  aVar12.mantissa = uVar4;
  aVar12._12_4_ = 0;
  return aVar12;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa negative_digit_comp(bigint& bigmant, adjusted_mantissa am, int32_t exponent) noexcept {
  bigint& real_digits = bigmant;
  int32_t real_exp = exponent;

  // get the value of `b`, rounded down, and get a bigint representation of b+h
  adjusted_mantissa am_b = am;
  // gcc7 buf: use a lambda to remove the noexcept qualifier bug with -Wnoexcept-type.
  round<T>(am_b, [](adjusted_mantissa&a, int32_t shift) { round_down(a, shift); });
  T b;
  to_float(false, am_b, b);
  adjusted_mantissa theor = to_extended_halfway(b);
  bigint theor_digits(theor.mantissa);
  int32_t theor_exp = theor.power2;

  // scale real digits and theor digits to be same power.
  int32_t pow2_exp = theor_exp - real_exp;
  uint32_t pow5_exp = uint32_t(-real_exp);
  if (pow5_exp != 0) {
    FASTFLOAT_ASSERT(theor_digits.pow5(pow5_exp));
  }
  if (pow2_exp > 0) {
    FASTFLOAT_ASSERT(theor_digits.pow2(uint32_t(pow2_exp)));
  } else if (pow2_exp < 0) {
    FASTFLOAT_ASSERT(real_digits.pow2(uint32_t(-pow2_exp)));
  }

  // compare digits, and use it to director rounding
  int ord = real_digits.compare(theor_digits);
  adjusted_mantissa answer = am;
  round<T>(answer, [ord](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [ord](bool is_odd, bool _, bool __) -> bool {
      (void)_;  // not needed, since we've done our comparison
      (void)__; // not needed, since we've done our comparison
      if (ord > 0) {
        return true;
      } else if (ord < 0) {
        return false;
      } else {
        return is_odd;
      }
    });
  });

  return answer;
}